

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlif.c
# Opt level: O3

int Io_ReadBlifReorderFormalNames(Vec_Ptr_t *vTokens,Mio_Gate_t *pGate,Mio_Gate_t *pTwin)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Mio_Pin_t *pMVar5;
  char *pcVar6;
  size_t sVar7;
  void **ppvVar8;
  char *pcVar9;
  void *Entry;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  uint uVar15;
  
  uVar1 = vTokens->nSize;
  uVar14 = (ulong)uVar1;
  iVar13 = uVar1 - 3;
  iVar2 = Mio_GateReadPinNum(pGate);
  if (pTwin == (Mio_Gate_t *)0x0) {
    if (iVar13 != iVar2) {
      return 0;
    }
  }
  else if ((iVar13 != iVar2) && (iVar2 = Mio_GateReadPinNum(pGate), uVar1 - 4 != iVar2)) {
    return 0;
  }
  pMVar5 = Mio_GateReadPins(pGate);
  if (pMVar5 == (Mio_Pin_t *)0x0) {
    iVar2 = 0;
  }
  else {
    lVar11 = 2;
    iVar2 = 0;
    do {
      pcVar6 = Mio_PinReadName(pMVar5);
      iVar4 = (int)lVar11;
      if (vTokens->nSize <= iVar4) goto LAB_0032d060;
      sVar7 = strlen(pcVar6);
      pcVar9 = (char *)vTokens->pArray[lVar11];
      iVar3 = strncmp(pcVar6,pcVar9,(long)(int)sVar7);
      if (iVar3 != 0) goto LAB_0032cc19;
      if (pcVar9[(int)sVar7] != '=') {
        iVar2 = iVar4 + -2;
        goto LAB_0032cc19;
      }
      pMVar5 = Mio_PinReadNext(pMVar5);
      iVar2 = iVar2 + 1;
      lVar11 = lVar11 + 1;
    } while (pMVar5 != (Mio_Pin_t *)0x0);
    iVar2 = iVar4 + -1;
  }
LAB_0032cc19:
  iVar4 = Mio_GateReadPinNum(pGate);
  if (pTwin == (Mio_Gate_t *)0x0) {
    if (iVar2 == iVar4) {
      return 1;
    }
    for (pMVar5 = Mio_GateReadPins(pGate); pMVar5 != (Mio_Pin_t *)0x0;
        pMVar5 = Mio_PinReadNext(pMVar5)) {
      pcVar6 = Mio_PinReadName(pMVar5);
      if (2 < (int)uVar1) {
        sVar7 = strlen(pcVar6);
        uVar15 = vTokens->nSize;
        uVar10 = 2;
        if (2 < (int)uVar15) {
          uVar10 = (ulong)uVar15;
        }
        uVar12 = 2;
        do {
          if (uVar10 == uVar12) goto LAB_0032d060;
          ppvVar8 = vTokens->pArray;
          pcVar9 = (char *)ppvVar8[uVar12];
          iVar2 = strncmp(pcVar6,pcVar9,(long)(int)sVar7);
          if ((iVar2 == 0) && (pcVar9[(int)sVar7] == '=')) {
            if (uVar15 == vTokens->nCap) {
              if (uVar15 < 0x10) {
                ppvVar8 = (void **)realloc(ppvVar8,0x80);
                iVar2 = 0x10;
              }
              else {
                iVar2 = uVar15 * 2;
                ppvVar8 = (void **)realloc(ppvVar8,(ulong)uVar15 << 4);
              }
              vTokens->pArray = ppvVar8;
              vTokens->nCap = iVar2;
            }
            iVar2 = vTokens->nSize;
            vTokens->nSize = iVar2 + 1;
            ppvVar8[iVar2] = pcVar9;
            break;
          }
          uVar12 = uVar12 + 1;
        } while (uVar14 != uVar12);
      }
    }
    pcVar6 = Mio_GateReadOutName(pGate);
    uVar15 = vTokens->nSize;
    if (2 < (int)uVar1) {
      sVar7 = strlen(pcVar6);
      uVar10 = 2;
      if (2 < (int)uVar15) {
        uVar10 = (ulong)uVar15;
      }
      uVar12 = 2;
      do {
        if (uVar10 == uVar12) goto LAB_0032d060;
        ppvVar8 = vTokens->pArray;
        pcVar9 = (char *)ppvVar8[uVar12];
        iVar2 = strncmp(pcVar6,pcVar9,(long)(int)sVar7);
        if ((iVar2 == 0) && (pcVar9[(int)sVar7] == '=')) {
          if (uVar15 == vTokens->nCap) {
            if (uVar15 < 0x10) {
              ppvVar8 = (void **)realloc(ppvVar8,0x80);
              iVar2 = 0x10;
            }
            else {
              iVar2 = uVar15 * 2;
              ppvVar8 = (void **)realloc(ppvVar8,(ulong)uVar15 << 4);
            }
            vTokens->pArray = ppvVar8;
            vTokens->nCap = iVar2;
          }
          iVar2 = vTokens->nSize;
          uVar15 = iVar2 + 1;
          vTokens->nSize = uVar15;
          ppvVar8[iVar2] = pcVar9;
          break;
        }
        uVar12 = uVar12 + 1;
      } while (uVar14 != uVar12);
    }
    if (uVar15 - uVar1 != uVar1 - 2) {
      return 0;
    }
    if ((int)uVar1 < (int)uVar15) {
      lVar11 = 2;
      do {
        if ((int)uVar1 < 0) goto LAB_0032d060;
        if ((int)uVar15 <= lVar11) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
        }
        vTokens->pArray[lVar11] = vTokens->pArray[lVar11 + (uVar14 - 2)];
        lVar11 = lVar11 + 1;
      } while ((int)((int)lVar11 + uVar1 + -2) < (int)uVar15);
    }
    if ((int)uVar15 < (int)uVar1) {
      __assert_fail("p->nSize >= nSizeNew",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                    ,0x232,"void Vec_PtrShrink(Vec_Ptr_t *, int)");
    }
    vTokens->nSize = uVar1;
    return 1;
  }
  if (iVar2 != iVar4) {
    return 0;
  }
  iVar2 = Mio_GateReadPinNum(pGate);
  if (iVar13 == iVar2) {
    pcVar6 = Mio_GateReadOutName(pGate);
    sVar7 = strlen(pcVar6);
    if ((0 < (int)uVar1) && ((int)uVar1 <= vTokens->nSize)) {
      pcVar9 = (char *)vTokens->pArray[uVar1 - 1];
      iVar2 = strncmp(pcVar6,pcVar9,(long)(int)sVar7);
      if ((iVar2 == 0) && (pcVar9[(int)sVar7] == '=')) {
        Entry = (void *)0x0;
      }
      else {
        pcVar6 = Mio_GateReadOutName(pTwin);
        if (vTokens->nSize < (int)uVar1) goto LAB_0032d060;
        sVar7 = strlen(pcVar6);
        pcVar9 = (char *)vTokens->pArray[uVar1 - 1];
        iVar2 = strncmp(pcVar6,pcVar9,(long)(int)sVar7);
        if (iVar2 != 0) {
          return 0;
        }
        if (pcVar9[(int)sVar7] != '=') {
          return 0;
        }
        Entry = Vec_PtrPop(vTokens);
        Vec_PtrPush(vTokens,(void *)0x0);
      }
      Vec_PtrPush(vTokens,Entry);
      return 1;
    }
  }
  else {
    iVar2 = Mio_GateReadPinNum(pGate);
    if (uVar1 - 4 != iVar2) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioReadBlif.c"
                    ,0x295,
                    "int Io_ReadBlifReorderFormalNames(Vec_Ptr_t *, Mio_Gate_t *, Mio_Gate_t *)");
    }
    pcVar6 = Mio_GateReadOutName(pGate);
    sVar7 = strlen(pcVar6);
    if ((1 < (int)uVar1) && ((int)(uVar1 - 2) < vTokens->nSize)) {
      pcVar9 = (char *)vTokens->pArray[uVar1 - 2];
      iVar2 = strncmp(pcVar6,pcVar9,(long)(int)sVar7);
      if (iVar2 != 0) {
        return 0;
      }
      if (pcVar9[(int)sVar7] == '=') {
        pcVar6 = Mio_GateReadOutName(pTwin);
        sVar7 = strlen(pcVar6);
        pcVar9 = (char *)Vec_PtrEntry(vTokens,uVar1 - 1);
        iVar2 = strncmp(pcVar6,pcVar9,(long)(int)sVar7);
        if (iVar2 == 0) {
          return (uint)(pcVar9[(int)sVar7] == '=');
        }
        return 0;
      }
      return 0;
    }
  }
LAB_0032d060:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

int Io_ReadBlifReorderFormalNames( Vec_Ptr_t * vTokens, Mio_Gate_t * pGate, Mio_Gate_t * pTwin )
{
    Mio_Pin_t * pGatePin;
    char * pName, * pNamePin;
    int i, k, nSize, Length;
    nSize = Vec_PtrSize(vTokens);
    if ( pTwin == NULL )
    {
        if ( nSize - 3 != Mio_GateReadPinNum(pGate) )
            return 0;
    }
    else
    {
        if ( nSize - 3 != Mio_GateReadPinNum(pGate) && nSize - 4 != Mio_GateReadPinNum(pGate) )
            return 0;
    }
    // check if the names are in order
    for ( pGatePin = Mio_GateReadPins(pGate), i = 0; pGatePin; pGatePin = Mio_PinReadNext(pGatePin), i++ )
    {
        pNamePin = Mio_PinReadName(pGatePin);
        Length = strlen(pNamePin);
        pName = (char *)Vec_PtrEntry(vTokens, i+2);
        if ( !strncmp( pNamePin, pName, Length ) && pName[Length] == '=' )
            continue;
        break;
    }
    if ( pTwin == NULL )
    {
        if ( i == Mio_GateReadPinNum(pGate) )
            return 1;
        // reorder the pins
        for ( pGatePin = Mio_GateReadPins(pGate), i = 0; pGatePin; pGatePin = Mio_PinReadNext(pGatePin), i++ )
        {
            pNamePin = Mio_PinReadName(pGatePin);
            Length = strlen(pNamePin);
            for ( k = 2; k < nSize; k++ )
            {
                pName = (char *)Vec_PtrEntry(vTokens, k);
                if ( !strncmp( pNamePin, pName, Length ) && pName[Length] == '=' )
                {
                    Vec_PtrPush( vTokens, pName );
                    break;
                }
            }
        }
        pNamePin = Mio_GateReadOutName(pGate);
        Length = strlen(pNamePin);
        for ( k = 2; k < nSize; k++ )
        {
            pName = (char *)Vec_PtrEntry(vTokens, k);
            if ( !strncmp( pNamePin, pName, Length ) && pName[Length] == '=' )
            {
                Vec_PtrPush( vTokens, pName );
                break;
            }
        }
        if ( Vec_PtrSize(vTokens) - nSize != nSize - 2 )
            return 0;
        Vec_PtrForEachEntryStart( char *, vTokens, pName, k, nSize )
            Vec_PtrWriteEntry( vTokens, k - nSize + 2, pName );
        Vec_PtrShrink( vTokens, nSize );
    }
    else
    {
        if ( i != Mio_GateReadPinNum(pGate) ) // expect the correct order of input pins in the network with twin gates
            return 0;
        // check the last two entries
        if ( nSize - 3 == Mio_GateReadPinNum(pGate) ) // only one output is available
        {
            pNamePin = Mio_GateReadOutName(pGate);
            Length = strlen(pNamePin);
            pName = (char *)Vec_PtrEntry(vTokens, nSize - 1);
            if ( !strncmp( pNamePin, pName, Length ) && pName[Length] == '=' ) // the last entry is pGate
            {
                Vec_PtrPush( vTokens, NULL );
                return 1;
            }
            pNamePin = Mio_GateReadOutName(pTwin);
            Length = strlen(pNamePin);
            pName = (char *)Vec_PtrEntry(vTokens, nSize - 1);
            if ( !strncmp( pNamePin, pName, Length ) && pName[Length] == '=' ) // the last entry is pTwin
            {
                pName = (char *)Vec_PtrPop( vTokens );
                Vec_PtrPush( vTokens, NULL );
                Vec_PtrPush( vTokens, pName );
                return 1;
            }
            return 0;
        }
        if ( nSize - 4 == Mio_GateReadPinNum(pGate) ) // two outputs are available
        {
            pNamePin = Mio_GateReadOutName(pGate);
            Length = strlen(pNamePin);
            pName = (char *)Vec_PtrEntry(vTokens, nSize - 2);
            if ( !(!strncmp( pNamePin, pName, Length ) && pName[Length] == '=') )
                return 0;
            pNamePin = Mio_GateReadOutName(pTwin);
            Length = strlen(pNamePin);
            pName = (char *)Vec_PtrEntry(vTokens, nSize - 1);
            if ( !(!strncmp( pNamePin, pName, Length ) && pName[Length] == '=') )
                return 0;
            return 1;
        }
        assert( 0 );
    }
    return 1;
}